

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O3

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::doAddRows(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *set,bool scale)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  pointer pnVar4;
  Item *pIVar5;
  undefined8 uVar6;
  bool bVar7;
  uint uVar8;
  undefined8 *puVar9;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  pointer pnVar15;
  LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pLVar16;
  undefined8 *puVar17;
  soplex *psVar18;
  uint *puVar19;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar20;
  Item *pIVar21;
  long lVar22;
  cpp_dec_float<200U,_int,_void> *pcVar23;
  int iVar24;
  int iVar25;
  long in_FS_OFFSET;
  byte bVar26;
  DataArray<int> local_420;
  DataArray<int> *local_408;
  DataKey local_400;
  undefined4 local_3f8;
  uint uStack_3f4;
  undefined4 uStack_3f0;
  undefined4 uStack_3ec;
  double local_3e8;
  undefined8 uStack_3e0;
  LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_3d8;
  soplex local_230 [112];
  undefined4 local_1c0;
  undefined1 local_1bc;
  undefined8 local_1b8;
  soplex local_1b0 [112];
  int local_140;
  undefined1 local_13c;
  undefined8 local_138;
  soplex local_130 [112];
  int local_c0;
  undefined1 local_bc;
  undefined8 local_b8;
  soplex local_b0 [112];
  int local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  bVar26 = 0;
  iVar1 = (this->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  local_420.data = (int *)0x0;
  local_420.memFactor = 1.2;
  local_420.thesize = 0;
  if (0 < iVar1) {
    local_420.thesize = iVar1;
  }
  local_420.themax = 1;
  if (0 < iVar1) {
    local_420.themax = local_420.thesize;
  }
  spx_alloc<int*>(&local_420.data,local_420.themax);
  iVar1 = (this->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  uVar2 = (this->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  uVar8 = uVar2;
  if ((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *)set != this) {
    LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::add(&this->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ,set);
    uVar8 = (this->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thenum;
  }
  if (0 < (int)uVar8) {
    memset(local_420.data,0,(ulong)uVar8 << 2);
  }
  lVar12 = (long)(set->
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).set.thenum;
  if (0 < lVar12) {
    do {
      pIVar21 = (set->
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).set.theitem;
      iVar25 = (set->
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).set.thekey[lVar12 + -1].idx;
      lVar14 = (long)pIVar21[iVar25].data.
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused;
      if (0 < lVar14) {
        do {
          iVar3 = pIVar21[iVar25].data.
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .m_elem[lVar14 + -1].idx;
          if ((this->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum <= iVar3) {
            LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::LPColBase(&local_3d8,0);
            DataArray<int>::reSize(&local_420,iVar3 + 1);
            iVar24 = (this->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum;
            lVar22 = (long)iVar24;
            if (iVar24 <= iVar3) {
              iVar24 = (iVar3 - iVar24) + 1;
              do {
                local_420.data[lVar22] = 0;
                local_400.info = 0;
                local_400.idx = -1;
                LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::add(&this->
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ,&local_400,&local_3d8);
                lVar22 = lVar22 + 1;
                iVar24 = iVar24 + -1;
              } while (iVar24 != 0);
            }
            local_3d8.vec._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006a69e0;
            if (local_3d8.vec.theelem !=
                (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x0) {
              free(local_3d8.vec.theelem);
            }
          }
          local_420.data[iVar3] = local_420.data[iVar3] + 1;
          bVar7 = 1 < lVar14;
          lVar14 = lVar14 + -1;
        } while (bVar7);
      }
      bVar7 = 1 < lVar12;
      lVar12 = lVar12 + -1;
    } while (bVar7);
  }
  lVar12 = (long)(this->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum;
  if (0 < lVar12) {
    uVar13 = lVar12 + 1;
    do {
      if (0 < local_420.data[uVar13 - 2]) {
        pIVar21 = (this->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.theitem +
                  (this->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thekey[uVar13 - 2].idx;
        iVar25 = local_420.data[uVar13 - 2] +
                 (pIVar21->data).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .memused;
        SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::xtend(&(this->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ,(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)pIVar21,iVar25);
        (this->
        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .set.theitem
        [(this->
         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).
         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         .set.thekey[uVar13 - 2].idx].data.
        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .memused = iVar25;
      }
      uVar13 = uVar13 - 1;
    } while (1 < uVar13);
  }
  iVar25 = (this->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thenum;
  if (iVar1 < iVar25) {
    lVar12 = (long)iVar25;
    local_408 = &(this->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).scaleExp;
    local_3e8 = *(double *)(in_FS_OFFSET + -8);
    local_3f8 = SUB84(local_3e8,0);
    uStack_3e0 = 0;
    uStack_3f4 = (uint)((ulong)local_3e8 >> 0x20) ^ 0x80000000;
    uStack_3f0 = 0;
    uStack_3ec = 0x80000000;
    do {
      lVar14 = lVar12 + -1;
      lVar12 = lVar12 + -1;
      pIVar21 = (this->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.theitem +
                (this->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thekey[lVar14].idx;
      uVar8 = 0;
      if (scale) {
        uVar8 = (*this->lp_scaler->_vptr_SPxScaler[1])(this->lp_scaler,pIVar21,local_408);
        pcVar23 = &(this->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).right.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar12].m_backend;
        ::soplex::infinity::__tls_init();
        local_3d8.up.m_backend.fpclass = cpp_dec_float_finite;
        local_3d8.up.m_backend.prec_elem = 0x1c;
        local_3d8.up.m_backend.data._M_elems[0] = 0;
        local_3d8.up.m_backend.data._M_elems[1] = 0;
        local_3d8.up.m_backend.data._M_elems[2] = 0;
        local_3d8.up.m_backend.data._M_elems[3] = 0;
        local_3d8.up.m_backend.data._M_elems[4] = 0;
        local_3d8.up.m_backend.data._M_elems[5] = 0;
        local_3d8.up.m_backend.data._M_elems[6] = 0;
        local_3d8.up.m_backend.data._M_elems[7] = 0;
        local_3d8.up.m_backend.data._M_elems[8] = 0;
        local_3d8.up.m_backend.data._M_elems[9] = 0;
        local_3d8.up.m_backend.data._M_elems[10] = 0;
        local_3d8.up.m_backend.data._M_elems[0xb] = 0;
        local_3d8.up.m_backend.data._M_elems[0xc] = 0;
        local_3d8.up.m_backend.data._M_elems[0xd] = 0;
        local_3d8.up.m_backend.data._M_elems[0xe] = 0;
        local_3d8.up.m_backend.data._M_elems[0xf] = 0;
        local_3d8.up.m_backend.data._M_elems[0x10] = 0;
        local_3d8.up.m_backend.data._M_elems[0x11] = 0;
        local_3d8.up.m_backend.data._M_elems[0x12] = 0;
        local_3d8.up.m_backend.data._M_elems[0x13] = 0;
        local_3d8.up.m_backend.data._M_elems[0x14] = 0;
        local_3d8.up.m_backend.data._M_elems[0x15] = 0;
        local_3d8.up.m_backend.data._M_elems[0x16] = 0;
        local_3d8.up.m_backend.data._M_elems[0x17] = 0;
        local_3d8.up.m_backend.data._M_elems[0x18] = 0;
        local_3d8.up.m_backend.data._M_elems[0x19] = 0;
        local_3d8.up.m_backend.data._M_elems._104_5_ = 0;
        local_3d8.up.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        local_3d8.up.m_backend.exp = 0;
        local_3d8.up.m_backend.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&local_3d8,local_3e8);
        if (((pcVar23->fpclass != cpp_dec_float_NaN) &&
            (local_3d8.up.m_backend.fpclass != cpp_dec_float_NaN)) &&
           (iVar25 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (pcVar23,(cpp_dec_float<200U,_int,_void> *)&local_3d8), iVar25 < 0))
        {
          pnVar4 = (this->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).right.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pnVar15 = pnVar4 + lVar12;
          psVar18 = local_b0;
          for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
            *(undefined4 *)psVar18 = (pnVar15->m_backend).data._M_elems[0];
            pnVar15 = (pointer)((long)pnVar15 + ((ulong)bVar26 * -2 + 1) * 4);
            psVar18 = psVar18 + (ulong)bVar26 * -8 + 4;
          }
          local_40 = pnVar4[lVar12].m_backend.exp;
          local_3c = pnVar4[lVar12].m_backend.neg;
          local_38._0_4_ = pnVar4[lVar12].m_backend.fpclass;
          local_38._4_4_ = pnVar4[lVar12].m_backend.prec_elem;
          spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                      *)&local_3d8,local_b0,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)(ulong)uVar8,CONCAT31((int3)((uint)local_40 >> 8),local_3c));
          pnVar4 = (this->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).right.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pLVar16 = &local_3d8;
          pnVar15 = pnVar4 + lVar12;
          for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
            (pnVar15->m_backend).data._M_elems[0] = (pLVar16->up).m_backend.data._M_elems[0];
            pLVar16 = (LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)((long)pLVar16 + (ulong)bVar26 * -8 + 4);
            pnVar15 = (pointer)((long)pnVar15 + ((ulong)bVar26 * -2 + 1) * 4);
          }
          pnVar4[lVar12].m_backend.exp = local_3d8.up.m_backend.exp;
          pnVar4[lVar12].m_backend.neg = local_3d8.up.m_backend.neg;
          pnVar4[lVar12].m_backend.fpclass = local_3d8.up.m_backend.fpclass;
          pnVar4[lVar12].m_backend.prec_elem = local_3d8.up.m_backend.prec_elem;
        }
        pcVar23 = &(this->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).left.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar12].m_backend;
        ::soplex::infinity::__tls_init();
        local_3d8.up.m_backend.fpclass = cpp_dec_float_finite;
        local_3d8.up.m_backend.prec_elem = 0x1c;
        local_3d8.up.m_backend.data._M_elems[0] = 0;
        local_3d8.up.m_backend.data._M_elems[1] = 0;
        local_3d8.up.m_backend.data._M_elems[2] = 0;
        local_3d8.up.m_backend.data._M_elems[3] = 0;
        local_3d8.up.m_backend.data._M_elems[4] = 0;
        local_3d8.up.m_backend.data._M_elems[5] = 0;
        local_3d8.up.m_backend.data._M_elems[6] = 0;
        local_3d8.up.m_backend.data._M_elems[7] = 0;
        local_3d8.up.m_backend.data._M_elems[8] = 0;
        local_3d8.up.m_backend.data._M_elems[9] = 0;
        local_3d8.up.m_backend.data._M_elems[10] = 0;
        local_3d8.up.m_backend.data._M_elems[0xb] = 0;
        local_3d8.up.m_backend.data._M_elems[0xc] = 0;
        local_3d8.up.m_backend.data._M_elems[0xd] = 0;
        local_3d8.up.m_backend.data._M_elems[0xe] = 0;
        local_3d8.up.m_backend.data._M_elems[0xf] = 0;
        local_3d8.up.m_backend.data._M_elems[0x10] = 0;
        local_3d8.up.m_backend.data._M_elems[0x11] = 0;
        local_3d8.up.m_backend.data._M_elems[0x12] = 0;
        local_3d8.up.m_backend.data._M_elems[0x13] = 0;
        local_3d8.up.m_backend.data._M_elems[0x14] = 0;
        local_3d8.up.m_backend.data._M_elems[0x15] = 0;
        local_3d8.up.m_backend.data._M_elems[0x16] = 0;
        local_3d8.up.m_backend.data._M_elems[0x17] = 0;
        local_3d8.up.m_backend.data._M_elems[0x18] = 0;
        local_3d8.up.m_backend.data._M_elems[0x19] = 0;
        local_3d8.up.m_backend.data._M_elems._104_5_ = 0;
        local_3d8.up.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        local_3d8.up.m_backend.exp = 0;
        local_3d8.up.m_backend.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&local_3d8,(double)CONCAT44(uStack_3f4,local_3f8)
                  );
        if (((pcVar23->fpclass != cpp_dec_float_NaN) &&
            (local_3d8.up.m_backend.fpclass != cpp_dec_float_NaN)) &&
           (iVar25 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (pcVar23,(cpp_dec_float<200U,_int,_void> *)&local_3d8), 0 < iVar25))
        {
          pnVar4 = (this->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).left.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pnVar15 = pnVar4 + lVar12;
          psVar18 = local_130;
          for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
            *(undefined4 *)psVar18 = (pnVar15->m_backend).data._M_elems[0];
            pnVar15 = (pointer)((long)pnVar15 + ((ulong)bVar26 * -2 + 1) * 4);
            psVar18 = psVar18 + (ulong)bVar26 * -8 + 4;
          }
          local_c0 = pnVar4[lVar12].m_backend.exp;
          local_bc = pnVar4[lVar12].m_backend.neg;
          local_b8._0_4_ = pnVar4[lVar12].m_backend.fpclass;
          local_b8._4_4_ = pnVar4[lVar12].m_backend.prec_elem;
          spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                      *)&local_3d8,local_130,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)(ulong)uVar8,CONCAT31((int3)((uint)local_c0 >> 8),local_bc));
          pnVar4 = (this->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).left.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pLVar16 = &local_3d8;
          pnVar15 = pnVar4 + lVar12;
          for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
            (pnVar15->m_backend).data._M_elems[0] = (pLVar16->up).m_backend.data._M_elems[0];
            pLVar16 = (LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)((long)pLVar16 + (ulong)bVar26 * -8 + 4);
            pnVar15 = (pointer)((long)pnVar15 + ((ulong)bVar26 * -2 + 1) * 4);
          }
          pnVar4[lVar12].m_backend.exp = local_3d8.up.m_backend.exp;
          pnVar4[lVar12].m_backend.neg = local_3d8.up.m_backend.neg;
          pnVar4[lVar12].m_backend.fpclass = local_3d8.up.m_backend.fpclass;
          pnVar4[lVar12].m_backend.prec_elem = local_3d8.up.m_backend.prec_elem;
        }
        pnVar4 = (this->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).object.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pnVar15 = pnVar4 + lVar12;
        psVar18 = local_1b0;
        for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
          *(undefined4 *)psVar18 = (pnVar15->m_backend).data._M_elems[0];
          pnVar15 = (pointer)((long)pnVar15 + ((ulong)bVar26 * -2 + 1) * 4);
          psVar18 = psVar18 + (ulong)bVar26 * -8 + 4;
        }
        local_140 = pnVar4[lVar12].m_backend.exp;
        local_13c = pnVar4[lVar12].m_backend.neg;
        local_138._0_4_ = pnVar4[lVar12].m_backend.fpclass;
        local_138._4_4_ = pnVar4[lVar12].m_backend.prec_elem;
        spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                    *)&local_3d8,local_1b0,
                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)(ulong)uVar8,CONCAT31((int3)((uint)local_140 >> 8),local_13c));
        pnVar4 = (this->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).object.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pLVar16 = &local_3d8;
        pnVar15 = pnVar4 + lVar12;
        for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
          (pnVar15->m_backend).data._M_elems[0] = (pLVar16->up).m_backend.data._M_elems[0];
          pLVar16 = (LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((long)pLVar16 + (ulong)bVar26 * -8 + 4);
          pnVar15 = (pointer)((long)pnVar15 + ((ulong)bVar26 * -2 + 1) * 4);
        }
        pnVar4[lVar12].m_backend.exp = local_3d8.up.m_backend.exp;
        pnVar4[lVar12].m_backend.neg = local_3d8.up.m_backend.neg;
        pnVar4[lVar12].m_backend.fpclass = local_3d8.up.m_backend.fpclass;
        pnVar4[lVar12].m_backend.prec_elem = local_3d8.up.m_backend.prec_elem;
        (this->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).scaleExp.data[lVar12] = uVar8;
      }
      lVar14 = (long)(pIVar21->data).
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused;
      if (0 < lVar14) {
        uVar13 = lVar14 + 1;
        lVar14 = lVar14 * 0x84 + -0xc;
        do {
          pNVar10 = (pIVar21->data).
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .m_elem;
          iVar25 = *(int *)((long)(pNVar10->val).m_backend.data._M_elems + lVar14 + 8);
          pIVar5 = (this->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.theitem;
          iVar3 = (this->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thekey[iVar25].idx;
          lVar22 = (long)pIVar5[iVar3].data.
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .memused - (long)local_420.data[iVar25];
          local_420.data[iVar25] = local_420.data[iVar25] + -1;
          pNVar20 = pIVar5[iVar3].data.
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .m_elem;
          pNVar20[lVar22].idx = (int)lVar12;
          if (scale) {
            puVar9 = (undefined8 *)((long)(pNVar10->val).m_backend.data._M_elems + lVar14);
            puVar17 = puVar9 + -0xf;
            psVar18 = local_230;
            for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
              *(undefined4 *)psVar18 = *(undefined4 *)puVar17;
              puVar17 = (undefined8 *)((long)puVar17 + (ulong)bVar26 * -8 + 4);
              psVar18 = psVar18 + (ulong)bVar26 * -8 + 4;
            }
            local_1c0 = *(undefined4 *)(puVar9 + -1);
            local_1bc = *(undefined1 *)((long)puVar9 + -4);
            local_1b8 = *puVar9;
            spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                        *)&local_3d8,local_230,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)(ulong)((this->
                                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).scaleExp.data[iVar25] + uVar8),
                       CONCAT31((int3)((uint)local_1c0 >> 8),local_1bc));
            puVar17 = (undefined8 *)
                      ((long)(((pIVar21->data).
                               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .m_elem)->val).m_backend.data._M_elems + lVar14);
            pLVar16 = &local_3d8;
            puVar19 = (uint *)(puVar17 + -0xf);
            for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
              *puVar19 = (pLVar16->up).m_backend.data._M_elems[0];
              pLVar16 = (LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)((long)pLVar16 + (ulong)bVar26 * -8 + 4);
              puVar19 = puVar19 + (ulong)bVar26 * -2 + 1;
            }
            *(int *)(puVar17 + -1) = local_3d8.up.m_backend.exp;
            *(bool *)((long)puVar17 + -4) = local_3d8.up.m_backend.neg;
            *puVar17 = local_3d8.up.m_backend._120_8_;
            pNVar10 = (pIVar21->data).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .m_elem;
            pNVar20 = pIVar5[iVar3].data.
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .m_elem;
          }
          puVar9 = (undefined8 *)((long)(pNVar10->val).m_backend.data._M_elems + lVar14);
          puVar17 = puVar9 + -0xf;
          pNVar10 = pNVar20 + lVar22;
          for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
            (pNVar10->val).m_backend.data._M_elems[0] = *(undefined4 *)puVar17;
            puVar17 = (undefined8 *)((long)puVar17 + (ulong)bVar26 * -8 + 4);
            pNVar10 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)((long)pNVar10 + ((ulong)bVar26 * -2 + 1) * 4);
          }
          pNVar20[lVar22].val.m_backend.exp = *(int *)(puVar9 + -1);
          pNVar20[lVar22].val.m_backend.neg = *(bool *)((long)puVar9 + -4);
          uVar6 = *puVar9;
          pNVar20[lVar22].val.m_backend.fpclass = (int)uVar6;
          pNVar20[lVar22].val.m_backend.prec_elem = (int)((ulong)uVar6 >> 0x20);
          uVar13 = uVar13 - 1;
          lVar14 = lVar14 + -0x84;
        } while (1 < uVar13);
      }
    } while (iVar1 < lVar12);
    iVar25 = (this->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thenum;
  }
  (*(this->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x50])(this,(ulong)(uint)(iVar25 - iVar1));
  (*(this->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x51])
            (this,(ulong)((this->
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thenum - uVar2));
  if (local_420.data != (int *)0x0) {
    free(local_420.data);
  }
  return;
}

Assistant:

void doAddRows(const LPRowSetBase<R>& set, bool scale = false)
   {
      int i, j, k, ii, idx;
      SVectorBase<R>* col;
      DataArray < int > newCols(nCols());
      int oldRowNumber = nRows();
      int oldColNumber = nCols();

      if(&set != this)
         LPRowSetBase<R>::add(set);

      assert(LPRowSetBase<R>::isConsistent());
      assert(LPColSetBase<R>::isConsistent());

      // count additional nonzeros per column
      for(i = nCols() - 1; i >= 0; --i)
         newCols[i] = 0;

      for(i = set.num() - 1; i >= 0; --i)
      {
         const SVectorBase<R>& vec = set.rowVector(i);

         for(j = vec.size() - 1; j >= 0; --j)
         {
            // create new columns if required
            ii = vec.index(j);

            if(ii >= nCols())
            {
               LPColBase<R> empty;
               newCols.reSize(ii + 1);

               for(k = nCols(); k <= ii; ++k)
               {
                  newCols[k] = 0;
                  LPColSetBase<R>::add(empty);
               }
            }

            assert(ii < nCols());
            newCols[ii]++;
         }
      }

      // extend columns as required (backward because of memory efficiency reasons)
      for(i = nCols() - 1; i >= 0; --i)
      {
         if(newCols[i] > 0)
         {
            int len = newCols[i] + colVector(i).size();
            LPColSetBase<R>::xtend(i, len);

            /* preset the sizes: beware that this can irritate a consistency check call from xtend(). We need to set the
             * sizes here, because a possible garbage collection called from xtend might destroy the sizes again. */
            colVector_w(i).set_size(len);
         }
      }

      // compute new row scaling factor and insert new elements to column file
      for(i = nRows() - 1; i >= oldRowNumber; --i)
      {
         SVectorBase<R>& vec = rowVector_w(i);
         int newRowScaleExp = 0;

         DataArray <int>& colscaleExp = LPColSetBase<R>::scaleExp;

         // compute new row scaling factor and apply it to the sides
         if(scale)
         {
            newRowScaleExp = lp_scaler->computeScaleExp(vec, colscaleExp);

            if(rhs(i) < R(infinity))
               rhs_w(i) = spxLdexp(rhs_w(i), newRowScaleExp);

            if(lhs(i) > R(-infinity))
               lhs_w(i) = spxLdexp(lhs_w(i), newRowScaleExp);

            maxRowObj_w(i) = spxLdexp(maxRowObj_w(i), newRowScaleExp);

            LPRowSetBase<R>::scaleExp[i] = newRowScaleExp;
         }

         for(j = vec.size() - 1; j >= 0; --j)
         {
            k = vec.index(j);
            col = &colVector_w(k);
            idx = col->size() - newCols[k];
            assert(newCols[k] > 0);
            assert(idx >= 0);
            newCols[k]--;
            col->index(idx) = i;

            // apply new row and existing column scaling factors to both ColSet and RowSet
            if(scale)
               vec.value(j) = spxLdexp(vec.value(j), newRowScaleExp + colscaleExp[k]);

            col->value(idx) = vec.value(j);
         }
      }

#ifndef NDEBUG

      for(i = 0; i < nCols(); ++i)
         assert(newCols[i] == 0);

#endif

      assert(SPxLPBase<R>::isConsistent());

      assert(set.num() == nRows() - oldRowNumber);
      addedRows(nRows() - oldRowNumber);
      addedCols(nCols() - oldColNumber);
   }